

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar11) [32];
  long lVar12;
  byte bVar13;
  _func_int **pp_Var14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined4 uVar33;
  undefined8 uVar34;
  undefined1 auVar35 [32];
  float fVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  int mask;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_24dc;
  RayQueryContext *local_24d8;
  ulong local_24d0;
  ulong *local_24c8;
  RayHit *local_24c0;
  Scene *local_24b8;
  long local_24b0;
  long local_24a8;
  RTCIntersectFunctionNArguments local_24a0;
  Geometry *local_2470;
  undefined8 local_2468;
  RTCIntersectArguments *local_2460;
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_24c8 = local_2368;
    local_2370[0] = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar30 = (ray->super_RayK<1>).tfar;
    auVar32 = ZEXT464((uint)fVar30);
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar21 = vandps_avx512vl((undefined1  [16])aVar2,auVar5);
    auVar23._8_4_ = 0x219392ef;
    auVar23._0_8_ = 0x219392ef219392ef;
    auVar23._12_4_ = 0x219392ef;
    auVar5 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar30));
    uVar16 = vcmpps_avx512vl(auVar21,auVar23,1);
    bVar3 = (bool)((byte)uVar16 & 1);
    auVar22._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.x;
    bVar3 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.y;
    bVar3 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.z;
    bVar3 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * aVar2.field_3.a;
    auVar23 = vrcp14ps_avx512vl(auVar22);
    auVar21._8_4_ = 0x3f800000;
    auVar21._0_8_ = 0x3f8000003f800000;
    auVar21._12_4_ = 0x3f800000;
    auVar21 = vfnmadd213ps_avx512vl(auVar22,auVar23,auVar21);
    auVar23 = vfmadd132ps_fma(auVar21,auVar23,auVar23);
    fVar30 = auVar23._0_4_;
    local_2398._4_4_ = fVar30;
    local_2398._0_4_ = fVar30;
    local_2398._8_4_ = fVar30;
    local_2398._12_4_ = fVar30;
    local_2398._16_4_ = fVar30;
    local_2398._20_4_ = fVar30;
    local_2398._24_4_ = fVar30;
    local_2398._28_4_ = fVar30;
    auVar40 = ZEXT3264(local_2398);
    auVar21 = vmovshdup_avx(auVar23);
    uVar34 = auVar21._0_8_;
    local_23b8._8_8_ = uVar34;
    local_23b8._0_8_ = uVar34;
    local_23b8._16_8_ = uVar34;
    local_23b8._24_8_ = uVar34;
    auVar41 = ZEXT3264(local_23b8);
    auVar22 = vshufpd_avx(auVar23,auVar23,1);
    auVar28._8_4_ = 2;
    auVar28._0_8_ = 0x200000002;
    auVar28._12_4_ = 2;
    auVar28._16_4_ = 2;
    auVar28._20_4_ = 2;
    auVar28._24_4_ = 2;
    auVar28._28_4_ = 2;
    fVar36 = fVar30 * (ray->super_RayK<1>).org.field_0.m128[0];
    local_23d8 = vpermps_avx2(auVar28,ZEXT1632(auVar23));
    auVar42 = ZEXT3264(local_23d8);
    auVar24._8_4_ = 1;
    auVar24._0_8_ = 0x100000001;
    auVar24._12_4_ = 1;
    auVar24._16_4_ = 1;
    auVar24._20_4_ = 1;
    auVar24._24_4_ = 1;
    auVar24._28_4_ = 1;
    auVar37 = ZEXT1632(CONCAT412(auVar23._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar23._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar23._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar36))
                                ));
    auVar24 = vpermps_avx2(auVar24,auVar37);
    auVar28 = vpermps_avx2(auVar28,auVar37);
    uVar16 = (ulong)(fVar30 < 0.0) << 5;
    uVar15 = (ulong)(auVar21._0_4_ < 0.0) << 5 | 0x40;
    uVar19 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x80;
    uVar18 = uVar16 ^ 0x20;
    uVar33 = auVar4._0_4_;
    local_23f8._4_4_ = uVar33;
    local_23f8._0_4_ = uVar33;
    local_23f8._8_4_ = uVar33;
    local_23f8._12_4_ = uVar33;
    local_23f8._16_4_ = uVar33;
    local_23f8._20_4_ = uVar33;
    local_23f8._24_4_ = uVar33;
    local_23f8._28_4_ = uVar33;
    auVar43 = ZEXT3264(local_23f8);
    uVar33 = auVar5._0_4_;
    auVar31 = ZEXT3264(CONCAT428(uVar33,CONCAT424(uVar33,CONCAT420(uVar33,CONCAT416(uVar33,CONCAT412
                                                  (uVar33,CONCAT48(uVar33,CONCAT44(uVar33,uVar33))))
                                                  ))));
    local_2418._0_8_ = CONCAT44(fVar36,fVar36) ^ 0x8000000080000000;
    local_2418._8_4_ = -fVar36;
    local_2418._12_4_ = -fVar36;
    local_2418._16_4_ = -fVar36;
    local_2418._20_4_ = -fVar36;
    local_2418._24_4_ = -fVar36;
    local_2418._28_4_ = -fVar36;
    auVar38 = ZEXT3264(local_2418);
    local_2438._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
    local_2438._8_4_ = auVar24._8_4_ ^ 0x80000000;
    local_2438._12_4_ = auVar24._12_4_ ^ 0x80000000;
    local_2438._16_4_ = auVar24._16_4_ ^ 0x80000000;
    local_2438._20_4_ = auVar24._20_4_ ^ 0x80000000;
    local_2438._24_4_ = auVar24._24_4_ ^ 0x80000000;
    local_2438._28_4_ = auVar24._28_4_ ^ 0x80000000;
    auVar39 = ZEXT3264(local_2438);
    local_2458._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
    local_2458._8_4_ = auVar28._8_4_ ^ 0x80000000;
    local_2458._12_4_ = auVar28._12_4_ ^ 0x80000000;
    local_2458._16_4_ = auVar28._16_4_ ^ 0x80000000;
    local_2458._20_4_ = auVar28._20_4_ ^ 0x80000000;
    local_2458._24_4_ = auVar28._24_4_ ^ 0x80000000;
    local_2458._28_4_ = auVar28._28_4_ ^ 0x80000000;
    auVar44 = ZEXT3264(local_2458);
    auVar24 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar45 = ZEXT3264(auVar24);
    auVar24 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar46 = ZEXT3264(auVar24);
    local_24d8 = context;
    local_24d0 = uVar16;
    local_24c0 = ray;
    do {
      pfVar1 = (float *)(local_24c8 + -1);
      local_24c8 = local_24c8 + -2;
      if (*pfVar1 <= auVar32._0_4_) {
        uVar17 = *local_24c8;
        while ((uVar17 & 8) == 0) {
          pauVar11 = (undefined1 (*) [32])(uVar17 & 0xfffffffffffffff0);
          uVar33 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar25._4_4_ = uVar33;
          auVar25._0_4_ = uVar33;
          auVar25._8_4_ = uVar33;
          auVar25._12_4_ = uVar33;
          auVar25._16_4_ = uVar33;
          auVar25._20_4_ = uVar33;
          auVar25._24_4_ = uVar33;
          auVar25._28_4_ = uVar33;
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar11[8] + uVar16),auVar25,
                                   *(undefined1 (*) [32])(pauVar11[2] + uVar16));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar40._0_32_,auVar38._0_32_);
          auVar24 = vmaxps_avx(auVar43._0_32_,ZEXT1632(auVar4));
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar11[8] + uVar15),auVar25,
                                   *(undefined1 (*) [32])(pauVar11[2] + uVar15));
          auVar5 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar11[8] + uVar19),auVar25,
                                   *(undefined1 (*) [32])(pauVar11[2] + uVar19));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar41._0_32_,auVar39._0_32_);
          auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar42._0_32_,auVar44._0_32_);
          auVar28 = vmaxps_avx(ZEXT1632(auVar4),ZEXT1632(auVar5));
          auVar24 = vmaxps_avx(auVar24,auVar28);
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar11[8] + uVar18),auVar25,
                                   *(undefined1 (*) [32])(pauVar11[2] + uVar18));
          auVar5 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar11[8] + (uVar15 ^ 0x20)),auVar25,
                                   *(undefined1 (*) [32])(pauVar11[2] + (uVar15 ^ 0x20)));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar40._0_32_,auVar38._0_32_);
          auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar41._0_32_,auVar39._0_32_);
          auVar21 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar11[8] + (uVar19 ^ 0x20)),auVar25,
                                    *(undefined1 (*) [32])(pauVar11[2] + (uVar19 ^ 0x20)));
          auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar42._0_32_,auVar44._0_32_);
          auVar28 = vminps_avx(ZEXT1632(auVar5),ZEXT1632(auVar21));
          auVar37 = vminps_avx(auVar31._0_32_,ZEXT1632(auVar4));
          auVar28 = vminps_avx(auVar37,auVar28);
          uVar20 = vcmpps_avx512vl(auVar24,auVar28,2);
          if (((uint)uVar17 & 7) == 6) {
            uVar17 = vcmpps_avx512vl(auVar25,pauVar11[0xe],0xd);
            uVar8 = vcmpps_avx512vl(auVar25,pauVar11[0xf],1);
            uVar20 = uVar20 & uVar17 & uVar8;
          }
          bVar10 = (byte)uVar20;
          if (bVar10 == 0) {
            auVar4 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                            ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar32 = ZEXT1664(auVar4);
            goto LAB_01f31805;
          }
          auVar28 = *pauVar11;
          auVar37 = pauVar11[1];
          auVar25 = vmovdqa64_avx512vl(auVar45._0_32_);
          auVar25 = vpternlogd_avx512vl(auVar25,auVar24,auVar46._0_32_,0xf8);
          auVar26 = vpcompressd_avx512vl(auVar25);
          auVar27._0_4_ =
               (uint)(bVar10 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar25._0_4_;
          bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
          auVar27._4_4_ = (uint)bVar3 * auVar26._4_4_ | (uint)!bVar3 * auVar25._4_4_;
          bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
          auVar27._8_4_ = (uint)bVar3 * auVar26._8_4_ | (uint)!bVar3 * auVar25._8_4_;
          bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
          auVar27._12_4_ = (uint)bVar3 * auVar26._12_4_ | (uint)!bVar3 * auVar25._12_4_;
          bVar3 = (bool)((byte)(uVar20 >> 4) & 1);
          auVar27._16_4_ = (uint)bVar3 * auVar26._16_4_ | (uint)!bVar3 * auVar25._16_4_;
          bVar3 = (bool)((byte)(uVar20 >> 5) & 1);
          auVar27._20_4_ = (uint)bVar3 * auVar26._20_4_ | (uint)!bVar3 * auVar25._20_4_;
          bVar3 = (bool)((byte)(uVar20 >> 6) & 1);
          auVar27._24_4_ = (uint)bVar3 * auVar26._24_4_ | (uint)!bVar3 * auVar25._24_4_;
          bVar3 = SUB81(uVar20 >> 7,0);
          auVar27._28_4_ = (uint)bVar3 * auVar26._28_4_ | (uint)!bVar3 * auVar25._28_4_;
          auVar25 = vpermt2q_avx512vl(auVar28,auVar27,auVar37);
          uVar17 = auVar25._0_8_;
          bVar10 = bVar10 - 1 & bVar10;
          if (bVar10 != 0) {
            auVar25 = vpshufd_avx2(auVar27,0x55);
            vpermt2q_avx512vl(auVar28,auVar25,auVar37);
            auVar26 = vpminsd_avx2(auVar27,auVar25);
            auVar25 = vpmaxsd_avx2(auVar27,auVar25);
            bVar10 = bVar10 - 1 & bVar10;
            if (bVar10 == 0) {
              auVar27 = vpermi2q_avx512vl(auVar26,auVar28,auVar37);
              uVar17 = auVar27._0_8_;
              auVar28 = vpermt2q_avx512vl(auVar28,auVar25,auVar37);
              *local_24c8 = auVar28._0_8_;
              auVar24 = vpermd_avx2(auVar25,auVar24);
              *(int *)(local_24c8 + 1) = auVar24._0_4_;
              local_24c8 = local_24c8 + 2;
            }
            else {
              auVar7 = vpshufd_avx2(auVar27,0xaa);
              vpermt2q_avx512vl(auVar28,auVar7,auVar37);
              auVar35 = vpminsd_avx2(auVar26,auVar7);
              auVar26 = vpmaxsd_avx2(auVar26,auVar7);
              auVar7 = vpminsd_avx2(auVar25,auVar26);
              auVar25 = vpmaxsd_avx2(auVar25,auVar26);
              bVar10 = bVar10 - 1 & bVar10;
              if (bVar10 == 0) {
                auVar27 = vpermi2q_avx512vl(auVar35,auVar28,auVar37);
                uVar17 = auVar27._0_8_;
                auVar27 = vpermt2q_avx512vl(auVar28,auVar25,auVar37);
                *local_24c8 = auVar27._0_8_;
                auVar25 = vpermd_avx2(auVar25,auVar24);
                *(int *)(local_24c8 + 1) = auVar25._0_4_;
                auVar28 = vpermt2q_avx512vl(auVar28,auVar7,auVar37);
                local_24c8[2] = auVar28._0_8_;
                auVar24 = vpermd_avx2(auVar7,auVar24);
                *(int *)(local_24c8 + 3) = auVar24._0_4_;
                local_24c8 = local_24c8 + 4;
              }
              else {
                auVar26 = vpshufd_avx2(auVar27,0xff);
                vpermt2q_avx512vl(auVar28,auVar26,auVar37);
                auVar6 = vpminsd_avx2(auVar35,auVar26);
                auVar26 = vpmaxsd_avx2(auVar35,auVar26);
                auVar35 = vpminsd_avx2(auVar7,auVar26);
                auVar26 = vpmaxsd_avx2(auVar7,auVar26);
                auVar7 = vpminsd_avx2(auVar25,auVar26);
                auVar25 = vpmaxsd_avx2(auVar25,auVar26);
                bVar10 = bVar10 - 1 & bVar10;
                if (bVar10 == 0) {
                  auVar27 = vpermi2q_avx512vl(auVar6,auVar28,auVar37);
                  uVar17 = auVar27._0_8_;
                  auVar27 = vpermt2q_avx512vl(auVar28,auVar25,auVar37);
                  *local_24c8 = auVar27._0_8_;
                  auVar25 = vpermd_avx2(auVar25,auVar24);
                  *(int *)(local_24c8 + 1) = auVar25._0_4_;
                  auVar25 = vpermt2q_avx512vl(auVar28,auVar7,auVar37);
                  local_24c8[2] = auVar25._0_8_;
                  auVar25 = vpermd_avx2(auVar7,auVar24);
                  *(int *)(local_24c8 + 3) = auVar25._0_4_;
                  auVar28 = vpermt2q_avx512vl(auVar28,auVar35,auVar37);
                  local_24c8[4] = auVar28._0_8_;
                  auVar24 = vpermd_avx2(auVar35,auVar24);
                  *(int *)(local_24c8 + 5) = auVar24._0_4_;
                  local_24c8 = local_24c8 + 6;
                }
                else {
                  auVar29 = valignd_avx512vl(auVar27,auVar27,3);
                  auVar27 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                  auVar26 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar27,auVar6);
                  auVar27 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar26 = vpermt2d_avx512vl(auVar26,auVar27,auVar35);
                  auVar26 = vpermt2d_avx512vl(auVar26,auVar27,auVar7);
                  auVar27 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar25 = vpermt2d_avx512vl(auVar26,auVar27,auVar25);
                  auVar32 = ZEXT3264(auVar25);
                  bVar13 = bVar10;
                  do {
                    auVar27 = auVar32._0_32_;
                    auVar35._8_4_ = 1;
                    auVar35._0_8_ = 0x100000001;
                    auVar35._12_4_ = 1;
                    auVar35._16_4_ = 1;
                    auVar35._20_4_ = 1;
                    auVar35._24_4_ = 1;
                    auVar35._28_4_ = 1;
                    auVar25 = vpermd_avx2(auVar35,auVar29);
                    auVar29 = valignd_avx512vl(auVar29,auVar29,1);
                    vpermt2q_avx512vl(auVar28,auVar29,auVar37);
                    bVar13 = bVar13 - 1 & bVar13;
                    uVar34 = vpcmpd_avx512vl(auVar25,auVar27,5);
                    auVar25 = vpmaxsd_avx2(auVar25,auVar27);
                    bVar9 = (byte)uVar34 << 1;
                    auVar27 = valignd_avx512vl(auVar27,auVar27,7);
                    bVar3 = (bool)((byte)uVar34 & 1);
                    auVar26._4_4_ = (uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * auVar25._4_4_;
                    auVar26._0_4_ = auVar25._0_4_;
                    bVar3 = (bool)(bVar9 >> 2 & 1);
                    auVar26._8_4_ = (uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * auVar25._8_4_;
                    bVar3 = (bool)(bVar9 >> 3 & 1);
                    auVar26._12_4_ = (uint)bVar3 * auVar27._12_4_ | (uint)!bVar3 * auVar25._12_4_;
                    bVar3 = (bool)(bVar9 >> 4 & 1);
                    auVar26._16_4_ = (uint)bVar3 * auVar27._16_4_ | (uint)!bVar3 * auVar25._16_4_;
                    bVar3 = (bool)(bVar9 >> 5 & 1);
                    auVar26._20_4_ = (uint)bVar3 * auVar27._20_4_ | (uint)!bVar3 * auVar25._20_4_;
                    bVar3 = (bool)(bVar9 >> 6 & 1);
                    auVar26._24_4_ = (uint)bVar3 * auVar27._24_4_ | (uint)!bVar3 * auVar25._24_4_;
                    auVar26._28_4_ =
                         (uint)(bVar9 >> 7) * auVar27._28_4_ |
                         (uint)!(bool)(bVar9 >> 7) * auVar25._28_4_;
                    auVar32 = ZEXT3264(auVar26);
                  } while (bVar13 != 0);
                  lVar12 = (ulong)(uint)POPCOUNT((uint)bVar10) + 3;
                  do {
                    auVar25 = vpermi2q_avx512vl(auVar26,auVar28,auVar37);
                    *local_24c8 = auVar25._0_8_;
                    auVar27 = auVar32._0_32_;
                    auVar25 = vpermd_avx2(auVar27,auVar24);
                    *(int *)(local_24c8 + 1) = auVar25._0_4_;
                    auVar26 = valignd_avx512vl(auVar27,auVar27,1);
                    local_24c8 = local_24c8 + 2;
                    auVar32 = ZEXT3264(auVar26);
                    lVar12 = lVar12 + -1;
                  } while (lVar12 != 0);
                  auVar24 = vpermt2q_avx512vl(auVar28,auVar26,auVar37);
                  uVar17 = auVar24._0_8_;
                }
                auVar40 = ZEXT3264(local_2398);
                auVar41 = ZEXT3264(local_23b8);
                auVar42 = ZEXT3264(local_23d8);
                auVar43 = ZEXT3264(local_23f8);
                auVar38 = ZEXT3264(local_2418);
                auVar39 = ZEXT3264(local_2438);
                auVar44 = ZEXT3264(local_2458);
                auVar24 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                auVar45 = ZEXT3264(auVar24);
                auVar24 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                auVar46 = ZEXT3264(auVar24);
              }
            }
          }
        }
        local_24b0 = (ulong)((uint)uVar17 & 0xf) - 8;
        if (local_24b0 != 0) {
          local_24b8 = local_24d8->scene;
          local_24a8 = 0;
          do {
            local_24a0.geomID = *(uint *)((uVar17 & 0xfffffffffffffff0) + local_24a8 * 8);
            local_2470 = (local_24b8->geometries).items[local_24a0.geomID].ptr;
            if (((ray->super_RayK<1>).mask & local_2470->mask) != 0) {
              local_24a0.primID = *(uint *)((uVar17 & 0xfffffffffffffff0) + 4 + local_24a8 * 8);
              local_24dc = -1;
              local_24a0.valid = &local_24dc;
              local_24a0.geometryUserPtr = local_2470->userPtr;
              local_24a0.context = local_24d8->user;
              local_24a0.N = 1;
              local_2468 = 0;
              local_2460 = local_24d8->args;
              pp_Var14 = (_func_int **)local_2460->intersect;
              if (pp_Var14 == (_func_int **)0x0) {
                pp_Var14 = local_2470[1].super_RefCount._vptr_RefCount;
              }
              local_24a0.rayhit = (RTCRayHitN *)ray;
              (*(code *)pp_Var14)(&local_24a0);
              auVar40 = ZEXT3264(local_2398);
              auVar41 = ZEXT3264(local_23b8);
              auVar42 = ZEXT3264(local_23d8);
              auVar43 = ZEXT3264(local_23f8);
              auVar38 = ZEXT3264(local_2418);
              auVar39 = ZEXT3264(local_2438);
              auVar44 = ZEXT3264(local_2458);
              auVar24 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
              auVar45 = ZEXT3264(auVar24);
              auVar24 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
              auVar46 = ZEXT3264(auVar24);
              ray = local_24c0;
            }
            local_24a8 = local_24a8 + 1;
          } while (local_24b0 != local_24a8);
        }
        fVar30 = (ray->super_RayK<1>).tfar;
        auVar31 = ZEXT3264(CONCAT428(fVar30,CONCAT424(fVar30,CONCAT420(fVar30,CONCAT416(fVar30,
                                                  CONCAT412(fVar30,CONCAT48(fVar30,CONCAT44(fVar30,
                                                  fVar30))))))));
        auVar32 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        uVar16 = local_24d0;
      }
LAB_01f31805:
    } while (local_24c8 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }